

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool-gnu-make.cc
# Opt level: O1

void __thiscall GNUmakeTokenPool::Clear(GNUmakeTokenPool *this)

{
  int iVar1;
  
  iVar1 = this->used_;
  while (0 < iVar1) {
    (*(this->super_TokenPool)._vptr_TokenPool[4])(this);
    iVar1 = this->used_;
  }
  iVar1 = this->available_;
  while (1 < iVar1) {
    iVar1 = (*(this->super_TokenPool)._vptr_TokenPool[0xb])(this);
    if ((char)iVar1 != '\0') {
      this->available_ = this->available_ + -1;
    }
    iVar1 = this->available_;
  }
  return;
}

Assistant:

void GNUmakeTokenPool::Clear() {
  while (used_ > 0)
    Release();
  while (available_ > 1)
    Return();
}